

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall
MultiANN::MultiANN(MultiANN *this,int dim,ANNpoint x_coor,void *x_ptr,int k,int *tt,ANNpoint ss)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ANNpoint pAVar4;
  ANNpointArray ppAVar5;
  undefined8 in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  int k_1;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  
  in_RDI[8] = in_R8D;
  in_RDI[1] = in_ESI;
  in_RDI[2] = 1;
  *in_RDI = 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_RDI[1];
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 10) = pvVar3;
  pAVar4 = annAllocPt((int)((ulong)in_R9 >> 0x20),
                      (ANNcoord)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(ANNpoint *)(in_RDI + 0xc) = pAVar4;
  ppAVar5 = annAllocPts((int)((ulong)in_R9 >> 0x20),(int)in_R9);
  *(ANNpointArray *)(in_RDI + 4) = ppAVar5;
  pvVar3 = operator_new__(8000000);
  *(void **)(in_RDI + 6) = pvVar3;
  for (iVar6 = 0; iVar6 < in_RDI[1]; iVar6 = iVar6 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 10) + (long)iVar6 * 4) =
         *(undefined4 *)(in_R9 + (long)iVar6 * 4);
    *(undefined8 *)(*(long *)(in_RDI + 0xc) + (long)iVar6 * 8) =
         *(undefined8 *)(in_stack_00000008 + (long)iVar6 * 8);
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 4) + (long)(*in_RDI + -1) * 8) + (long)iVar6 * 8) =
         *(undefined8 *)(in_RDX + (long)iVar6 * 8);
  }
  *(undefined8 *)(*(long *)(in_RDI + 6) + (long)(*in_RDI + -1) * 8) = in_RCX;
  for (iVar6 = 0; iVar6 < 0x1f; iVar6 = iVar6 + 1) {
    (in_RDI + (long)iVar6 * 2 + 0xe)[0] = 0;
    (in_RDI + (long)iVar6 * 2 + 0xe)[1] = 0;
  }
  return;
}

Assistant:

MultiANN::MultiANN(   // constructor
    int dim,          // dimension of the space
    ANNpoint x_coor,  // coordinates of the initial point in the data structure
    void *x_ptr,      // pointer to the object holding the initial point
    int k,            // number of nearest neighbors to be returned
    int *tt,          // topology of the space
    ANNpoint ss)      // scaling of the coordinates
{
    NumNeighbors = k;
    dimension = dim;
    LastNodeCount = 1;
    size = 1;

    topology = new int[dimension];    // allocate topology array
    scaling = annAllocPt(dimension);  // allocate scaling array
    points_coor = annAllocPts(
        MAXPOINTS, dimension);  // allocate coordinates of the data points
    points_ptr = new void *[MAXPOINTS];  // allocate pointers to the data points

    for (int i = 0; i < dimension; i++) {
        topology[i] = tt[i];
        scaling[i] = ss[i];
        points_coor[size - 1][i] = x_coor[i];
    }
    points_ptr[size - 1] = (void *)x_ptr;

    for (int k = 0; k < ANN_MAXIMUM_INDEX + 1; k++) {
        AnnArray[k] = NULL;
    }
}